

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O1

Abc_Ntk_t * Io_ReadNetlist(char *pFileName,Io_FileType_t FileType,int fCheck)

{
  bool bVar1;
  Io_FileType_t IVar2;
  int iVar3;
  FILE *__stream;
  Abc_Ntk_t *pAVar4;
  Vec_Ptr_t *pVVar5;
  long lVar6;
  size_t __size;
  char *pcVar7;
  
  if ((FileType == IO_FILE_UNKNOWN) || (FileType == IO_FILE_NONE)) {
    fprintf(_stdout,"Generic file reader requires a known file extension to open \"%s\".\n",
            pFileName);
    return (Abc_Ntk_t *)0x0;
  }
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open input file \"%s\". ",pFileName);
    pcVar7 = Extra_FileGetSimilarName(pFileName,".blif",".bench",".pla",".baf",".aig");
    if (pcVar7 != (char *)0x0) {
      fprintf(_stdout,"Did you mean \"%s\"?",pcVar7);
    }
    fputc(10,_stdout);
    return (Abc_Ntk_t *)0x0;
  }
  fclose(__stream);
  if (FileType - IO_FILE_AIGER < 3) {
    if (FileType == IO_FILE_BAF) {
      pAVar4 = Io_ReadBaf(pFileName,fCheck);
    }
    else if (FileType == IO_FILE_AIGER) {
      pAVar4 = Io_ReadAiger(pFileName,fCheck);
    }
    else {
      pAVar4 = Io_ReadBblif(pFileName,fCheck);
    }
    if (pAVar4 != (Abc_Ntk_t *)0x0) {
      return pAVar4;
    }
    pcVar7 = "Reading AIG from file has failed.\n";
    __size = 0x22;
    goto LAB_00336155;
  }
  if (FileType == IO_FILE_BLIF) {
    iVar3 = 0;
LAB_0033608c:
    pAVar4 = Io_ReadBlifMv(pFileName,iVar3,fCheck);
  }
  else {
    IVar2 = Io_ReadFileType(pFileName);
    if (IVar2 == IO_FILE_BLIFMV) {
      iVar3 = 1;
      goto LAB_0033608c;
    }
    switch(FileType) {
    case IO_FILE_EDIF:
      pAVar4 = Io_ReadEdif(pFileName,fCheck);
      break;
    case IO_FILE_EQN:
      pAVar4 = Io_ReadEqn(pFileName,fCheck);
      break;
    case IO_FILE_GML:
    case IO_FILE_JSON:
    case IO_FILE_LIST:
    case IO_FILE_MOPLA:
    case IO_FILE_SMV:
switchD_00336187_caseD_c:
      Io_ReadNetlist_cold_1();
      return (Abc_Ntk_t *)0x0;
    case IO_FILE_PLA:
      pAVar4 = Io_ReadPla(pFileName,0,0,0,0,fCheck);
      break;
    case IO_FILE_VERILOG:
      pAVar4 = Io_ReadVerilog(pFileName,fCheck);
      break;
    default:
      if (FileType != IO_FILE_BENCH) goto switchD_00336187_caseD_c;
      pAVar4 = Io_ReadBench(pFileName,fCheck);
    }
  }
  if (pAVar4 != (Abc_Ntk_t *)0x0) {
    if (fCheck == 0) {
      return pAVar4;
    }
    if ((pAVar4->nObjCounts[10] == 0) && (pAVar4->nObjCounts[9] == 0)) {
      return pAVar4;
    }
    pVVar5 = pAVar4->pDesign->vModules;
    if (pVVar5->nSize < 1) {
      return pAVar4;
    }
    lVar6 = 0;
    bVar1 = false;
    do {
      iVar3 = Abc_NtkIsAcyclicWithBoxes((Abc_Ntk_t *)pVVar5->pArray[lVar6]);
      if (iVar3 == 0) {
        bVar1 = true;
      }
      lVar6 = lVar6 + 1;
      pVVar5 = pAVar4->pDesign->vModules;
    } while (lVar6 < pVVar5->nSize);
    if (bVar1) {
      Abc_NtkDelete(pAVar4);
      return (Abc_Ntk_t *)0x0;
    }
    return pAVar4;
  }
  pcVar7 = "Reading network from file has failed.\n";
  __size = 0x26;
LAB_00336155:
  fwrite(pcVar7,__size,1,_stdout);
  return (Abc_Ntk_t *)0x0;
}

Assistant:

Abc_Ntk_t * Io_ReadNetlist( char * pFileName, Io_FileType_t FileType, int fCheck )
{
    FILE * pFile;
    Abc_Ntk_t * pNtk;
    if ( FileType == IO_FILE_NONE || FileType == IO_FILE_UNKNOWN )
    {
        fprintf( stdout, "Generic file reader requires a known file extension to open \"%s\".\n", pFileName );
        return NULL;
    }
    // check if the file exists
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".blif", ".bench", ".pla", ".baf", ".aig" )) )
            fprintf( stdout, "Did you mean \"%s\"?", pFileName );
        fprintf( stdout, "\n" );
       return NULL;
    }
    fclose( pFile );
    // read the AIG
    if ( FileType == IO_FILE_AIGER || FileType == IO_FILE_BAF || FileType == IO_FILE_BBLIF )
    {
        if ( FileType == IO_FILE_AIGER )
            pNtk = Io_ReadAiger( pFileName, fCheck );
        else if ( FileType == IO_FILE_BAF )
            pNtk = Io_ReadBaf( pFileName, fCheck );
        else // if ( FileType == IO_FILE_BBLIF )
            pNtk = Io_ReadBblif( pFileName, fCheck );
        if ( pNtk == NULL )
        {
            fprintf( stdout, "Reading AIG from file has failed.\n" );
            return NULL;
        }
        return pNtk;
    }
    // read the new netlist
    if ( FileType == IO_FILE_BLIF )
//        pNtk = Io_ReadBlif( pFileName, fCheck );
        pNtk = Io_ReadBlifMv( pFileName, 0, fCheck );
    else if ( Io_ReadFileType(pFileName) == IO_FILE_BLIFMV )
        pNtk = Io_ReadBlifMv( pFileName, 1, fCheck );
    else if ( FileType == IO_FILE_BENCH )
        pNtk = Io_ReadBench( pFileName, fCheck );
    else if ( FileType == IO_FILE_EDIF )
        pNtk = Io_ReadEdif( pFileName, fCheck );
    else if ( FileType == IO_FILE_EQN )
        pNtk = Io_ReadEqn( pFileName, fCheck );
    else if ( FileType == IO_FILE_PLA )
        pNtk = Io_ReadPla( pFileName, 0, 0, 0, 0, fCheck );
    else if ( FileType == IO_FILE_VERILOG )
        pNtk = Io_ReadVerilog( pFileName, fCheck );
    else 
    {
        fprintf( stderr, "Unknown file format.\n" );
        return NULL;
    }
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Reading network from file has failed.\n" );
        return NULL;
    }
    if ( fCheck && (Abc_NtkBlackboxNum(pNtk) || Abc_NtkWhiteboxNum(pNtk)) )
    {
        int i, fCycle = 0;
        Abc_Ntk_t * pModel;
//        fprintf( stdout, "Warning: The network contains hierarchy.\n" );
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
                if ( !Abc_NtkIsAcyclicWithBoxes( pModel ) )
                    fCycle = 1;
        if ( fCycle )
        {
            Abc_NtkDelete( pNtk );
            return NULL;    
        }
    }
    return pNtk;
}